

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

void __thiscall Clasp::SatElite::attach(SatElite *this,uint32 clauseId,bool initialClause)

{
  bool bVar1;
  uint32 uVar2;
  Var VVar3;
  Clause *this_00;
  uint64 *puVar4;
  Literal *pLVar5;
  size_t *siglen;
  byte in_DL;
  uchar *sig;
  uint32 in_ESI;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Var v;
  uint32 i;
  Clause *c;
  key_type in_stack_ffffffffffffffa8;
  SatElite *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  indexed_priority_queue<Clasp::SatElite::LessOccCost> *in_stack_ffffffffffffffc0;
  uint local_1c;
  
  this_00 = SatPreprocessor::clause
                      (&in_stack_ffffffffffffffb0->super_SatPreprocessor,
                       (uint32)(in_stack_ffffffffffffffa8 >> 0x20));
  puVar4 = SatPreprocessor::Clause::abstraction(this_00);
  *puVar4 = 0;
  for (local_1c = 0; uVar2 = SatPreprocessor::Clause::size(this_00), local_1c != uVar2;
      local_1c = local_1c + 1) {
    pLVar5 = SatPreprocessor::Clause::operator[](this_00,local_1c);
    VVar3 = Literal::var(pLVar5);
    siglen = (size_t *)((ulong)VVar3 * 0x20);
    in_stack_ffffffffffffffb0 = (SatElite *)(*(long *)(in_RDI + 0x58) + (long)siglen);
    ctx = (EVP_PKEY_CTX *)(ulong)local_1c;
    uVar2 = in_ESI;
    pLVar5 = SatPreprocessor::Clause::operator[](this_00,local_1c);
    Literal::sign(pLVar5,ctx,sig,siglen,in_R8,in_R9);
    OccurList::add((OccurList *)in_stack_ffffffffffffffc0,uVar2,
                   SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    OccurList::unmark((OccurList *)(*(long *)(in_RDI + 0x58) + (ulong)VVar3 * 0x20));
    SatPreprocessor::Clause::operator[](this_00,local_1c);
    in_stack_ffffffffffffffc0 =
         (indexed_priority_queue<Clasp::SatElite::LessOccCost> *)
         SatPreprocessor::Clause::abstractLit((Literal)0x0);
    puVar4 = SatPreprocessor::Clause::abstraction(this_00);
    *puVar4 = (ulong)in_stack_ffffffffffffffc0 | *puVar4;
    bVar1 = bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::is_in_queue
                      (in_stack_ffffffffffffffc0,CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    if (bVar1) {
      bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::decrease
                ((indexed_priority_queue<Clasp::SatElite::LessOccCost> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
    else if ((in_DL & 1) != 0) {
      updateHeap(in_stack_ffffffffffffffb0,(Var)(in_stack_ffffffffffffffa8 >> 0x20));
    }
  }
  uVar2 = (uint32)((ulong)*(undefined8 *)(in_RDI + 0x58) >> 0x20);
  pLVar5 = SatPreprocessor::Clause::operator[](this_00,0);
  Literal::var(pLVar5);
  OccurList::addWatch((OccurList *)in_stack_ffffffffffffffb0,uVar2);
  addToSubQueue(in_stack_ffffffffffffffb0,uVar2);
  *(uint *)(in_RDI + 0xc) = (uint)((in_DL & 1 ^ 0xff) & 1) + *(int *)(in_RDI + 0xc);
  return;
}

Assistant:

void SatElite::attach(uint32 clauseId, bool initialClause) {
	Clause& c = *clause(clauseId);
	c.abstraction() = 0;
	for (uint32 i = 0; i != c.size(); ++i) {
		Var v = c[i].var();
		occurs_[v].add(clauseId, c[i].sign());
		occurs_[v].unmark();
		c.abstraction() |= Clause::abstractLit(c[i]);
		if (elimHeap_.is_in_queue(v)) {
			elimHeap_.decrease(v);
		}
		else if (initialClause) {
			updateHeap(v);
		}
	}
	occurs_[c[0].var()].addWatch(clauseId);
	addToSubQueue(clauseId);
	stats.clAdded += !initialClause;
}